

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::tlru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0>::
find_range_fill<std::unordered_map<unsigned_long,std::optional<unsigned_long>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::optional<unsigned_long>>>>>
          (tlru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0> *this,
          unordered_map<unsigned_long,_std::optional<unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<unsigned_long>_>_>_>
          *key_optional_value_range,peek peek)

{
  _Hash_node_base *p_Var1;
  time_point now;
  optional<unsigned_long> oVar2;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (p_Var1 = (key_optional_value_range->_M_h)._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    oVar2 = tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0>::do_find
                      ((tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0> *)this,
                       (unsigned_long *)(p_Var1 + 1),now,peek);
    ((_Storage<unsigned_long,_true> *)(p_Var1 + 2))->_M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    *(bool *)&p_Var1[3]._M_nxt =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
  }
  return;
}

Assistant:

auto find_range_fill(range_type& key_optional_value_range, peek peek = peek::no) -> void
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};
        for (auto& [key, optional_value] : key_optional_value_range)
        {
            optional_value = do_find(key, now, peek);
        }
    }